

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O3

void process_COM(int raw)

{
  uint uVar1;
  uint __c;
  ushort **ppuVar2;
  int iVar3;
  
  setlocale(0,"");
  uVar1 = read_2_bytes();
  if (uVar1 < 2) {
    process_COM_cold_1();
    iVar3 = getc((FILE *)infile);
    if (iVar3 != -1) {
      return;
    }
    read_1_byte_cold_1();
    iVar3 = getc((FILE *)infile);
    if (iVar3 == -1) {
      read_2_bytes_cold_2();
    }
    else {
      iVar3 = getc((FILE *)infile);
      if (iVar3 != -1) {
        return;
      }
    }
    read_2_bytes_cold_1();
    halt_baddata();
  }
  iVar3 = uVar1 - 2;
  if (iVar3 != 0) {
    uVar1 = 0;
    do {
      __c = read_1_byte();
      if (raw == 0) {
        if (__c == 10) {
          if (uVar1 != 0xd) {
LAB_00101879:
            putchar(10);
          }
        }
        else if (__c == 0x5c) {
          printf("\\\\");
        }
        else {
          if (__c == 0xd) goto LAB_00101879;
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (long)(int)__c * 2 + 1) & 0x40) != 0) goto LAB_0010181e;
          printf("\\%03o",(ulong)__c);
        }
      }
      else {
LAB_0010181e:
        putc(__c,_stdout);
      }
      iVar3 = iVar3 + -1;
      uVar1 = __c;
    } while (iVar3 != 0);
  }
  putchar(10);
  setlocale(0,"C");
  return;
}

Assistant:

static void
process_COM(int raw)
{
  unsigned int length;
  int ch;
  int lastch = 0;

  /* Bill Allombert: set locale properly for isprint */
#ifdef HAVE_LOCALE_H
  setlocale(LC_CTYPE, "");
#endif

  /* Get the marker parameter length count */
  length = read_2_bytes();
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;

  while (length > 0) {
    ch = read_1_byte();
    if (raw) {
      putc(ch, stdout);
    /* Emit the character in a readable form.
     * Nonprintables are converted to \nnn form,
     * while \ is converted to \\.
     * Newlines in CR, CR/LF, or LF form will be printed as one newline.
     */
    } else if (ch == '\r') {
      printf("\n");
    } else if (ch == '\n') {
      if (lastch != '\r')
        printf("\n");
    } else if (ch == '\\') {
      printf("\\\\");
    } else if (isprint(ch)) {
      putc(ch, stdout);
    } else {
      printf("\\%03o", ch);
    }
    lastch = ch;
    length--;
  }
  printf("\n");

  /* Bill Allombert: revert to C locale */
#ifdef HAVE_LOCALE_H
  setlocale(LC_CTYPE, "C");
#endif
}